

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp)

{
  int iVar1;
  undefined1 local_110 [8];
  stbi__context s;
  int *comp_local;
  int *y_local;
  int *x_local;
  int len_local;
  stbi_uc *buffer_local;
  
  s.img_buffer_original_end = (stbi_uc *)comp;
  stbi__start_mem((stbi__context *)local_110,buffer,len);
  iVar1 = stbi__info_main((stbi__context *)local_110,x,y,(int *)s.img_buffer_original_end);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__info_main(&s,x,y,comp);
}